

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall QListModel::insert(QListModel *this,int row,QStringList *labels)

{
  long lVar1;
  QListWidgetItem *pQVar2;
  QListWidget *pQVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  QListWidgetItem *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (uint)(labels->d).size;
  if (0 < (int)uVar4) {
    lVar1 = QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
    if ((lVar1 == 0) || (*(char *)(*(long *)(lVar1 + 8) + 0x5c0) != '\x01')) {
      if (row < 0) {
        iVar7 = 0;
      }
      else {
        uVar5 = (this->items).d.size;
        if ((uint)row <= uVar5) {
          uVar5 = (ulong)(uint)row;
        }
        iVar7 = (int)uVar5;
      }
      local_50 = (QListWidgetItem *)0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,iVar7);
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      lVar6 = 0;
      lVar1 = (long)iVar7;
      do {
        pQVar2 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar2,(QString *)((long)&(((labels->d).ptr)->d).d + lVar6),(QListWidget *)0x0,0)
        ;
        pQVar2->d->theid = (int)lVar1;
        pQVar3 = (QListWidget *)QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
        pQVar2->view = pQVar3;
        local_50 = pQVar2;
        QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
                  ((QPodArrayOps<QListWidgetItem*> *)&this->items,lVar1,&local_50);
        QList<QListWidgetItem_*>::begin(&this->items);
        lVar6 = lVar6 + 0x18;
        uVar5 = uVar5 - 1;
        lVar1 = lVar1 + 1;
      } while (uVar5 != 0);
      QAbstractItemModel::endInsertRows();
    }
    else {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      lVar1 = 0;
      do {
        pQVar2 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem
                  (pQVar2,(QString *)((long)&(((labels->d).ptr)->d).d + lVar1),(QListWidget *)0x0,0)
        ;
        insert(this,row,pQVar2);
        lVar1 = lVar1 + 0x18;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModel::insert(int row, const QStringList &labels)
{
    const int count = labels.size();
    if (count <= 0)
        return;
    QListWidget *view = this->view();
    if (view && view->isSortingEnabled()) {
        // sorted insertion
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            insert(row, item);
        }
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
        beginInsertRows(QModelIndex(), row, row + count - 1);
        for (int i = 0; i < count; ++i) {
            QListWidgetItem *item = new QListWidgetItem(labels.at(i));
            item->d->theid = row;
            item->view = this->view();
            items.insert(row++, item);
        }
        endInsertRows();
    }
}